

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = FLAGS_gtest_color_abi_cxx11_;
  if (FLAGS_gtest_color_abi_cxx11_ != (char *)0x0) {
    iVar1 = strcasecmp(FLAGS_gtest_color_abi_cxx11_,"auto");
    if (iVar1 == 0) {
      pcVar2 = getenv("TERM");
      if (pcVar2 == (char *)0x0) {
        bVar3 = false;
      }
      else {
        iVar1 = strcmp(pcVar2,"xterm");
        bVar3 = true;
        if ((((iVar1 != 0) && (iVar1 = strcmp(pcVar2,"xterm-color"), iVar1 != 0)) &&
            (iVar1 = strcmp(pcVar2,"xterm-256color"), iVar1 != 0)) &&
           (((iVar1 = strcmp(pcVar2,"screen"), iVar1 != 0 &&
             (iVar1 = strcmp(pcVar2,"screen-256color"), iVar1 != 0)) &&
            (iVar1 = strcmp(pcVar2,"linux"), iVar1 != 0)))) {
          iVar1 = strcmp(pcVar2,"cygwin");
          bVar3 = iVar1 == 0;
        }
      }
      return (bool)(bVar3 & stdout_is_tty);
    }
    iVar1 = strcasecmp(pcVar2,"yes");
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = strcasecmp(pcVar2,"true");
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = strcasecmp(pcVar2,"t");
    if (iVar1 == 0) {
      return true;
    }
    if (*pcVar2 == '1') {
      return pcVar2[1] == '\0';
    }
  }
  return false;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  const char* const gtest_color = GTEST_FLAG(color).c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}